

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
LimitedCovarianceBase<njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner>::
LimitedCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (LimitedCovarianceBase<njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner>
           *this,ControlRecord *cont,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  double ap;
  double spi;
  bool bVar1;
  _Storage<double,_true> local_70;
  undefined1 local_68;
  ControlRecord local_60;
  
  ap = (cont->
       super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  spi = (cont->
        super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
        ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Head_base<0UL,_double,_false>._M_head_impl;
  bVar1 = *(long *)&(cont->
                    super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                    ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long> != 0
  ;
  if (bVar1) {
    ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_60,it,end,lineNumber,MAT,MF,MT);
    local_70._M_value =
         local_60.
         super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
         .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
  }
  local_68 = bVar1;
  LimitedCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,spi,ap,(optional<double> *)&local_70,it,end,lineNumber,MAT,MF,MT,
             (int)((_Head_base<4UL,_long,_false> *)
                  ((long)&(cont->
                          super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                          ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long>.
                          super__Tuple_impl<4UL,_long,_long> + 8))->_M_head_impl);
  return;
}

Assistant:

LimitedCovarianceBase( ControlRecord&& cont,
                        Iterator& it, const Iterator& end, long& lineNumber,
                        int MAT, int MF, int MT ) :
  // no try ... catch: exceptions will be handled in the derived class
  LimitedCovarianceBase( cont.C1(), cont.C2(),
                         cont.N2()
                           ? std::make_optional( ControlRecord( it, end, lineNumber,
                                                                MAT, MF, MT ).C2() )
                           : std::nullopt,
                         it, end, lineNumber, MAT, MF, MT, cont.N1() ) {}